

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
copyBinary(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  byte bVar1;
  byte *pbVar2;
  unsigned_long __n;
  Exception *this_00;
  
  pbVar2 = *(byte **)this;
  bVar1 = *pbVar2;
  if ((bVar1 & 0xf8) == 0xc0) {
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    __n = readIntegerNonEmpty<unsigned_long>(pbVar2 + 1,(ulong)(bVar1 + 1 & 0xf));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(__return_storage_ptr__,__n);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
               (const_iterator)
               (__return_storage_ptr__->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish,(uchar *)(*(long *)this + (ulong)bVar1 + -0xbe),
               (uchar *)(*(long *)this + (ulong)bVar1 + __n + -0xbe));
    return __return_storage_ptr__;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,InvalidValueType,"Expecting type Binary");
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

std::vector<uint8_t> copyBinary() const {
    if (!isBinary()) {
      throw Exception(Exception::InvalidValueType, "Expecting type Binary");
    }

    uint8_t const h = head();
    VELOCYPACK_ASSERT(h >= 0xc0 && h <= 0xc7);

    std::vector<uint8_t> out;
    ValueLength length =
        readIntegerNonEmpty<ValueLength>(start() + 1, h - 0xbf);
    checkOverflow(length);
    out.reserve(static_cast<std::size_t>(length));
    out.insert(out.end(), start() + 1 + h - 0xbf,
               start() + 1 + h - 0xbf + length);
    return out;
  }